

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O1

int is_character(int c)

{
  return (int)(c == 0x5f || (c & 0xffffffdfU) - 0x41 < 0x1a);
}

Assistant:

int is_character(int c)
{
  if (c >= 'A' && c <= 'Z')
    return 1;
  if (c >= 'a' && c <= 'z')
    return 1;
  if (c == '_')
    return 1;
  return 0;
}